

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFileUnpacker.cpp
# Opt level: O3

bool __thiscall DatUnpacker::DatFileUnpacker::unpack(DatFileUnpacker *this,Arguments *arguments)

{
  pointer pcVar1;
  DatFileItem *pDVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  vector<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_> *pvVar6;
  long *plVar7;
  ostream *poVar8;
  uchar *puVar9;
  pointer ppDVar10;
  long *plVar11;
  size_type sVar12;
  string fullpath;
  string name;
  string directory;
  ofstream stream;
  DatFile datFile;
  long *local_710;
  long local_708;
  long local_700;
  long lStack_6f8;
  string local_6f0;
  undefined8 local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  pointer local_6b8;
  DatFileItem *local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  string local_688;
  undefined1 local_668 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_658 [14];
  ios_base local_570 [264];
  DatFile local_468;
  
  pcVar1 = (arguments->source)._M_dataplus._M_p;
  local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_688,pcVar1,pcVar1 + (arguments->source)._M_string_length);
  DatFile::DatFile(&local_468,&local_688,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688._M_dataplus._M_p != &local_688.field_2) {
    operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
  }
  DatFile::version(&local_468);
  pvVar6 = DatFile::items(&local_468);
  ppDVar10 = (pvVar6->
             super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_6c0 = (pvVar6->
              super__Vector_base<DatUnpacker::DatFileItem_*,_std::allocator<DatUnpacker::DatFileItem_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar10 != local_6c0) {
    local_6c8 = _VTT;
    local_6d0 = __M_split_cmpts;
    do {
      pDVar2 = *ppDVar10;
      local_6b8 = ppDVar10;
      DatFileItem::name_abi_cxx11_(&local_6f0,pDVar2);
      sVar4 = local_6f0._M_string_length;
      _Var3._M_p = local_6f0._M_dataplus._M_p;
      if (local_6f0._M_string_length != 0) {
        sVar12 = 0;
        do {
          if (local_6f0._M_dataplus._M_p[sVar12] == '\\') {
            local_6f0._M_dataplus._M_p[sVar12] = '/';
          }
          sVar12 = sVar12 + 1;
        } while (local_6f0._M_string_length != sVar12);
      }
      local_6b0 = pDVar2;
      if ((arguments->transformNames == true) && (local_6f0._M_string_length != 0)) {
        sVar12 = 0;
        do {
          iVar5 = tolower((int)_Var3._M_p[sVar12]);
          _Var3._M_p[sVar12] = (char)iVar5;
          sVar12 = sVar12 + 1;
        } while (sVar4 != sVar12);
      }
      local_668._0_8_ = local_658;
      pcVar1 = (arguments->destination)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_668,pcVar1,pcVar1 + (arguments->destination)._M_string_length);
      std::__cxx11::string::append((char *)local_668);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_668,(ulong)local_6f0._M_dataplus._M_p);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_700 = *plVar11;
        lStack_6f8 = plVar7[3];
        local_710 = &local_700;
      }
      else {
        local_700 = *plVar11;
        local_710 = (long *)*plVar7;
      }
      local_708 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_668._0_8_ != local_658) {
        operator_delete((void *)local_668._0_8_,local_658[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::string::rfind((char)&local_710,0x2f);
      std::__cxx11::string::substr((ulong)&local_6a8,(ulong)&local_710);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_668,&local_6a8,auto_format);
      pDVar2 = local_6b0;
      std::filesystem::create_directories((path *)local_668);
      std::filesystem::__cxx11::path::~path((path *)local_668);
      if (arguments->quietMode == false) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_710,local_708);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      std::ofstream::ofstream((path *)local_668);
      std::ofstream::open((char *)local_668,(_Ios_Openmode)local_710);
      puVar9 = DatFileItem::data(pDVar2);
      DatFileItem::unpackedSize(pDVar2);
      std::ostream::write((char *)local_668,(long)puVar9);
      std::ofstream::close();
      puVar9 = DatFileItem::data(pDVar2);
      if (puVar9 != (uchar *)0x0) {
        operator_delete__(puVar9);
      }
      local_668._0_8_ = local_6c8;
      *(undefined8 *)(local_668 + *(long *)(local_6c8 + -0x18)) = local_6d0;
      std::filebuf::~filebuf((filebuf *)(local_668 + 8));
      std::ios_base::~ios_base(local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
        operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
      }
      if (local_710 != &local_700) {
        operator_delete(local_710,local_700 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
        operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
      }
      ppDVar10 = local_6b8 + 1;
    } while (ppDVar10 != local_6c0);
  }
  DatFile::~DatFile(&local_468);
  return true;
}

Assistant:

bool DatFileUnpacker::unpack(const Arguments& arguments)
    {
        DatFile datFile(arguments.source);

        //if (arguments.format == Format::FALLOUT2) {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT2);
        //} else {
        //    datFile.setVersion(DatFile::VERSION::FALLOUT1);
        //}

        // TODO: refactor DatFile to get rid of this call
        if (datFile.version()) {

        }

        if (!checkDatFile(datFile, arguments)) {
            return false;
        }

        // extract items
        for (auto item : *datFile.items()) {

            std::string name = item->name();
            std::replace(name.begin(), name.end(), '\\', '/');

            if (arguments.transformNames) {
                std::transform(name.begin(), name.end(), name.begin(), ::tolower);
            }

            std::string fullpath = arguments.destination + "/" + name;
            std::string directory = fullpath.substr(0, fullpath.find_last_of('/'));

            std::filesystem::create_directories(directory);

            if (!arguments.quietMode) {
                std::cout << fullpath << std::endl;
            }

            std::ofstream stream;
            stream.open(fullpath.c_str(), std::ofstream::out | std::ofstream::binary);
            stream.write((char*)item->data(), item->unpackedSize());
            stream.close();
            delete [] item->data();
        }

        return true;
    }